

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int binchr(bstring b0,int pos,bstring b1)

{
  int len;
  uchar *data;
  int iVar1;
  int iVar2;
  charField chrs;
  
  iVar2 = -1;
  if (((b0 != (bstring)0x0 && -1 < pos) && (data = b0->data, data != (uchar *)0x0)) &&
     (len = b0->slen, pos < len)) {
    iVar1 = buildCharField(&chrs,b1);
    if (-1 < iVar1) {
      iVar2 = binchrCF(data,len,pos,&chrs);
    }
  }
  return iVar2;
}

Assistant:

int binchr (const bstring b0, int pos, const bstring b1) {
struct charField chrs;
	if (pos < 0 || b0 == NULL || b0->data == NULL ||
	    b0->slen <= pos) return BSTR_ERR;
	if (buildCharField (&chrs, b1) < 0) return BSTR_ERR;
	return binchrCF (b0->data, b0->slen, pos, &chrs);
}